

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O2

void * boomphf::
       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,boomphf::bfile_iterator<unsigned_long>>
                 (void *args)

{
  pthread_mutex_t *__mutex;
  int i;
  mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *this;
  shared_ptr<boomphf::bfile_iterator<unsigned_long>_> until_p;
  shared_ptr<boomphf::bfile_iterator<unsigned_long>_> startit;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  __shared_ptr<boomphf::bfile_iterator<unsigned_long>,_(__gnu_cxx::_Lock_policy)2> _Stack_88;
  __shared_ptr<boomphf::bfile_iterator<unsigned_long>,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<boomphf::bfile_iterator<unsigned_long>,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<boomphf::bfile_iterator<unsigned_long>,_(__gnu_cxx::_Lock_policy)2> local_58;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (args != (void *)0x0) {
    this = *args;
    i = *(int *)((long)args + 0x30);
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,10000);
    __mutex = (pthread_mutex_t *)(this + 0x268);
    pthread_mutex_lock(__mutex);
    std::static_pointer_cast<boomphf::bfile_iterator<unsigned_long>,void>
              ((shared_ptr<void> *)&local_58);
    std::static_pointer_cast<boomphf::bfile_iterator<unsigned_long>,void>
              ((shared_ptr<void> *)&local_68);
    pthread_mutex_unlock(__mutex);
    std::__shared_ptr<boomphf::bfile_iterator<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_78,&local_58);
    std::__shared_ptr<boomphf::bfile_iterator<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&_Stack_88,&local_68);
    mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
    pthread_processLevel<boomphf::bfile_iterator<unsigned_long>>
              (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
               (shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)&local_78,
               (shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)&_Stack_88,i);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  }
  return (void *)0x0;
}

Assistant:

void * thread_processLevel(void * args)
	{
		if(args ==NULL) return NULL;

		thread_args<Range,it_type> *targ = (thread_args<Range,it_type>*) args;

		mphf<elem_t, Hasher_t>  * obw = (mphf<elem_t, Hasher_t > *) targ->boophf;
		int level = targ->level;
		std::vector<elem_t> buffer;
		buffer.resize(NBBUFF);
		
		pthread_mutex_t * mutex =  & obw->_mutex;

		pthread_mutex_lock(mutex); // from comment above: "//get starting iterator for this thread, must be protected (must not be currently used by other thread to copy elems in buff)"
        std::shared_ptr<it_type> startit = std::static_pointer_cast<it_type>(targ->it_p);
        std::shared_ptr<it_type> until_p = std::static_pointer_cast<it_type>(targ->until_p);
		pthread_mutex_unlock(mutex);

		obw->pthread_processLevel(buffer, startit, until_p, level);

		return NULL;
	}